

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_string.cpp
# Opt level: O1

bool ublib::operator>=(Shared_string *lhs,Shared_string *rhs)

{
  uint uVar1;
  ulong uVar2;
  element_type *__n;
  difference_type __diff;
  ulong uVar3;
  element_type *__s2;
  element_type *__s1;
  
  __s1 = (element_type *)lhs->length_;
  __s2 = (element_type *)rhs->length_;
  uVar3 = (long)__s1 - (long)__s2;
  __n = __s2;
  if (__s1 < __s2) {
    __n = __s1;
  }
  if (__n == (element_type *)0x0) {
    uVar2 = 0;
  }
  else {
    if (__s2 != (element_type *)0x0) {
      __s2 = (rhs->underlying_).super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    if (__s1 != (element_type *)0x0) {
      __s1 = (lhs->underlying_).super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    uVar1 = memcmp(__s1,__s2,(size_t)__n);
    uVar2 = (ulong)uVar1;
  }
  if ((int)uVar2 == 0) {
    uVar2 = 0xffffffff80000000;
    if (-0x80000000 < (long)uVar3) {
      uVar2 = uVar3;
    }
    if (0x7ffffffe < (long)uVar2) {
      uVar2 = 0x7fffffff;
    }
  }
  return -1 < (int)uVar2;
}

Assistant:

bool operator>=(Shared_string const& lhs, Shared_string const& rhs) noexcept {
  return std::string_view(lhs) >= std::string_view(rhs);
}